

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *
__thiscall
chatra::RuntimeImp::getInstancesState
          (vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
           *__return_storage_ptr__,RuntimeImp *this)

{
  anon_class_16_2_633ba7ce process;
  IllegalRuntimeStateException *this_00;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock0;
  RuntimeImp *this_local;
  vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *ret;
  
  lock0._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->lockDebugger);
  if ((this->paused & 1U) != 0) {
    std::vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>::
    vector(__return_storage_ptr__);
    process.ret = __return_storage_ptr__;
    process.this = this;
    IdPool<chatra::InstanceId,chatra::Instance>::
    forEach<chatra::RuntimeImp::getInstancesState()::__0>
              ((IdPool<chatra::InstanceId,chatra::Instance> *)&this->instanceIds,process);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    return __return_storage_ptr__;
  }
  this_00 = (IllegalRuntimeStateException *)__cxa_allocate_exception(0x28);
  (this_00->super_UnsupportedOperationException).super_NativeException.message._M_string_length = 0;
  (this_00->super_UnsupportedOperationException).super_NativeException.message.field_2.
  _M_allocated_capacity = 0;
  *(undefined8 *)&(this_00->super_UnsupportedOperationException).super_NativeException = 0;
  *(undefined8 *)&(this_00->super_UnsupportedOperationException).super_NativeException.message = 0;
  *(undefined8 *)
   ((long)&(this_00->super_UnsupportedOperationException).super_NativeException.message.field_2 + 8)
       = 0;
  debugger::IllegalRuntimeStateException::IllegalRuntimeStateException(this_00);
  __cxa_throw(this_00,&debugger::IllegalRuntimeStateException::typeinfo,
              debugger::IllegalRuntimeStateException::~IllegalRuntimeStateException);
}

Assistant:

std::vector<debugger::InstanceState> RuntimeImp::getInstancesState() {
	CHATRA_CHECK_RUNTIME_PAUSED;

	std::vector<debugger::InstanceState> ret;
	instanceIds.forEach([&](const Instance& instance) {
		auto instanceId = instance.getId();
		if (instanceId == finalizerInstanceId || instanceId == gcInstance->getId())
			return;

		ret.emplace_back();
		auto& v = ret.back();

		v.instanceId = instance.getId();
		v.primaryPackageId = instance.primaryPackageId;

		std::lock_guard<SpinLock> lock1(instance.lockThreads);
		v.threadIds.reserve(instance.threads.size());
		for (auto& e : instance.threads)
			v.threadIds.emplace_back(static_cast<debugger::ThreadId>(static_cast<size_t>(e.first)));
	});
	return ret;
}